

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_union_inplace(run_container_t *src_1,run_container_t *src_2)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  run_container_t *in_RSI;
  run_container_t *in_RDI;
  rle16_t newrl;
  rle16_t previousrle;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t input1nruns;
  rle16_t *inputsrc1;
  int32_t neededcapacity;
  int32_t maxoutput;
  _Bool if2;
  _Bool if1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  rle16_t vl;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  rle16_t local_38;
  int local_34;
  int local_30;
  int32_t local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  rle16_t *prVar5;
  undefined4 in_stack_ffffffffffffffe0;
  
  _Var1 = run_container_is_full(in_RDI);
  _Var2 = run_container_is_full(in_RSI);
  if ((_Var1) || (_Var2)) {
    if (_Var1) {
      return;
    }
    if (_Var2) {
      run_container_copy((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      return;
    }
  }
  iVar3 = in_RDI->n_runs + in_RSI->n_runs;
  iVar4 = iVar3 + in_RDI->n_runs;
  if (in_RDI->capacity < iVar4) {
    run_container_grow((run_container_t *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                       (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x18,0));
  }
  memmove(in_RDI->runs + iVar3,in_RDI->runs,(long)in_RDI->n_runs << 2);
  prVar5 = in_RDI->runs + iVar3;
  local_2c = in_RDI->n_runs;
  in_RDI->n_runs = 0;
  local_30 = 0;
  local_34 = 0;
  if (in_RSI->runs->value < prVar5->value) {
    local_38 = run_container_append_first(in_RDI,*in_RSI->runs);
    local_34 = local_34 + 1;
  }
  else {
    local_38 = run_container_append_first(in_RDI,*prVar5);
    local_30 = local_30 + 1;
  }
  while (local_34 < in_RSI->n_runs && local_30 < local_2c) {
    if (in_RSI->runs[local_34].value < prVar5[local_30].value) {
      vl = in_RSI->runs[local_34];
      local_34 = local_34 + 1;
    }
    else {
      vl = prVar5[local_30];
      local_30 = local_30 + 1;
    }
    run_container_append(in_RDI,vl,&local_38);
  }
  for (; local_34 < in_RSI->n_runs; local_34 = local_34 + 1) {
    run_container_append(in_RDI,in_RSI->runs[local_34],&local_38);
  }
  for (; local_30 < local_2c; local_30 = local_30 + 1) {
    run_container_append(in_RDI,prVar5[local_30],&local_38);
  }
  return;
}

Assistant:

void run_container_union_inplace(run_container_t *src_1,
                                 const run_container_t *src_2) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return;
        }
        if (if2) {
            run_container_copy(src_2, src_1);
            return;
        }
    }
    // we move the data to the end of the current array
    const int32_t maxoutput = src_1->n_runs + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_1->n_runs;
    if (src_1->capacity < neededcapacity)
        run_container_grow(src_1, neededcapacity, true);
    memmove(src_1->runs + maxoutput, src_1->runs,
            src_1->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc1 = src_1->runs + maxoutput;
    const int32_t input1nruns = src_1->n_runs;
    src_1->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(src_1, inputsrc1[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(src_1, src_2->runs[xrlepos]);
        xrlepos++;
    }
    while ((xrlepos < src_2->n_runs) && (rlepos < input1nruns)) {
        rle16_t newrl;
        if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = inputsrc1[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(src_1, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(src_1, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < input1nruns) {
        run_container_append(src_1, inputsrc1[rlepos], &previousrle);
        rlepos++;
    }
}